

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageloader.cpp
# Opt level: O2

bool __thiscall stackjit::AssemblyImage::loadFunctionBody(AssemblyImage *this,string *function)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *this_00;
  OpCodes opCode;
  undefined1 auVar1 [8];
  undefined4 uVar2;
  char cVar3;
  mapped_type *pmVar4;
  mapped_type *this_01;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_02;
  unsigned_long uVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_03;
  OpCodes *pOVar6;
  InstructionFormats *pIVar7;
  vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_> *pvVar8;
  size_t *in_RCX;
  uint *index;
  size_t i;
  long lVar9;
  string *psVar10;
  pointer pcVar11;
  bool bVar12;
  string calledClassType;
  string value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  params;
  string local;
  undefined1 local_230 [8];
  string local_228;
  string local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_1c8;
  string *local_1c0;
  size_type local_1b8;
  unsigned_long local_1b0;
  unsigned_long local_1a8;
  Instruction local_1a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  string local_70;
  string local_50;
  
  this_00 = &this->mFunctionBodyOffsets;
  local_1b8 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::count(&this_00->_M_h,function);
  if (local_1b8 != 0) {
    pmVar4 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_00,function);
    local_230 = (undefined1  [8])*pmVar4;
    this_01 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Function>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Function>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Function>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Function>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->mFunctions,function);
    AssemblyImageLoader::loadAttributes_abi_cxx11_
              ((AttributeContainer *)&local_1a0,(AssemblyImageLoader *)this,(BinaryData *)local_230,
               in_RCX);
    this_02 = &Loader::Function::attributes_abi_cxx11_(this_01)->_M_h;
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::operator=(this_02,(_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)&local_1a0);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&local_1a0);
    uVar5 = anon_unknown_4::loadData<unsigned_long>(&this->mImageData,(size_t *)local_230);
    while (bVar12 = uVar5 != 0, uVar5 = uVar5 - 1, bVar12) {
      (anonymous_namespace)::loadString_abi_cxx11_
                ((string *)&local_1a0,(_anonymous_namespace_ *)this,(BinaryData *)local_230,in_RCX);
      this_03 = Loader::Function::localTypes_abi_cxx11_(this_01);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this_03,(value_type *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_1a0);
    }
    local_1c8 = &this_00->_M_h;
    local_1c0 = function;
    local_1b0 = anon_unknown_4::loadData<unsigned_long>(&this->mImageData,(size_t *)local_230);
    uVar5 = 0;
    while (uVar5 != local_1b0) {
      local_1a8 = uVar5;
      cVar3 = anon_unknown_4::loadData<char>(&this->mImageData,(size_t *)local_230);
      auVar1 = local_230;
      pOVar6 = (OpCodes *)
               std::vector<char,_std::allocator<char>_>::at(&this->mImageData,(size_type)local_230);
      opCode = *pOVar6;
      pcVar11 = (pointer)((long)auVar1 + 1);
      index = &switchD_00166e09::switchdataD_0017e708;
      local_230 = (undefined1  [8])pcVar11;
      switch(cVar3) {
      case '\0':
        pvVar8 = Loader::Function::instructions(this_01);
        Loader::Instruction::make(opCode);
        std::vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>::
        emplace_back<stackjit::Loader::Instruction>(pvVar8,&local_1a0);
        break;
      case '\x01':
        for (lVar9 = 0; uVar2 = local_1a0._0_4_, lVar9 != 4; lVar9 = lVar9 + 1) {
          pIVar7 = (InstructionFormats *)
                   std::vector<char,_std::allocator<char>_>::at
                             (&this->mImageData,(size_type)(pcVar11 + lVar9));
          (&local_1a0.mFormat)[lVar9] = *pIVar7;
        }
        local_230 = (undefined1  [8])(pcVar11 + lVar9);
        pvVar8 = Loader::Function::instructions(this_01);
        Loader::Instruction::makeWithInt(&local_1a0,opCode,uVar2);
        std::vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>::
        emplace_back<stackjit::Loader::Instruction>(pvVar8,&local_1a0);
        break;
      case '\x02':
        for (lVar9 = 0; uVar2 = local_1a0._0_4_, lVar9 != 4; lVar9 = lVar9 + 1) {
          pIVar7 = (InstructionFormats *)
                   std::vector<char,_std::allocator<char>_>::at
                             (&this->mImageData,(size_type)(pcVar11 + lVar9));
          (&local_1a0.mFormat)[lVar9] = *pIVar7;
        }
        local_230 = (undefined1  [8])(pcVar11 + lVar9);
        pvVar8 = Loader::Function::instructions(this_01);
        Loader::Instruction::makeWithFloat(opCode,(float)uVar2);
        std::vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>::
        emplace_back<stackjit::Loader::Instruction>(pvVar8,&local_1a0);
        break;
      case '\x03':
        cVar3 = anon_unknown_4::loadData<char>(&this->mImageData,(size_t *)local_230);
        pvVar8 = Loader::Function::instructions(this_01);
        Loader::Instruction::makeWithChar(&local_1a0,opCode,cVar3);
        std::vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>::
        emplace_back<stackjit::Loader::Instruction>(pvVar8,&local_1a0);
        break;
      case '\x04':
        (anonymous_namespace)::loadString_abi_cxx11_
                  (&local_208,(_anonymous_namespace_ *)this,(BinaryData *)local_230,
                   (size_t *)&switchD_00166e09::switchdataD_0017e708);
        pvVar8 = Loader::Function::instructions(this_01);
        psVar10 = &local_50;
        std::__cxx11::string::string((string *)psVar10,(string *)&local_208);
        Loader::Instruction::makeWithString(&local_1a0,opCode,psVar10);
        std::vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>::
        emplace_back<stackjit::Loader::Instruction>(pvVar8,&local_1a0);
        goto LAB_00167050;
      case '\x05':
        (anonymous_namespace)::loadString_abi_cxx11_
                  (&local_208,(_anonymous_namespace_ *)this,(BinaryData *)local_230,
                   (size_t *)&switchD_00166e09::switchdataD_0017e708);
        pvVar8 = Loader::Function::instructions(this_01);
        psVar10 = &local_70;
        std::__cxx11::string::string((string *)psVar10,(string *)&local_208);
        Loader::Instruction::makeWithStringConstant(&local_1a0,opCode,psVar10);
        std::vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>::
        emplace_back<stackjit::Loader::Instruction>(pvVar8,&local_1a0);
LAB_00167050:
        Loader::Instruction::~Instruction(&local_1a0);
LAB_00167254:
        std::__cxx11::string::~string((string *)psVar10);
LAB_00167259:
        std::__cxx11::string::~string((string *)&local_208);
        goto switchD_00166e09_default;
      case '\x06':
        (anonymous_namespace)::loadString_abi_cxx11_
                  (&local_208,(_anonymous_namespace_ *)this,(BinaryData *)local_230,
                   (size_t *)&switchD_00166e09::switchdataD_0017e708);
        uVar5 = anon_unknown_4::loadData<unsigned_long>(&this->mImageData,(size_t *)local_230);
        local_228._M_dataplus._M_p = (pointer)0x0;
        local_228._M_string_length = 0;
        local_228.field_2._M_allocated_capacity = 0;
        while (bVar12 = uVar5 != 0, uVar5 = uVar5 - 1, bVar12) {
          (anonymous_namespace)::loadString_abi_cxx11_
                    ((string *)&local_1a0,(_anonymous_namespace_ *)this,(BinaryData *)local_230,
                     (size_t *)index);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     (local_230 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a0
                    );
          std::__cxx11::string::~string((string *)&local_1a0);
        }
        pvVar8 = Loader::Function::instructions(this_01);
        std::__cxx11::string::string((string *)&local_c0,(string *)&local_208);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_88,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_230 + 8));
        Loader::Instruction::makeCall(&local_1a0,&local_c0,&local_88);
        std::vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>::
        emplace_back<stackjit::Loader::Instruction>(pvVar8,&local_1a0);
        Loader::Instruction::~Instruction(&local_1a0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_88);
        std::__cxx11::string::~string((string *)&local_c0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_230 + 8));
        goto LAB_00167259;
      case '\a':
        (anonymous_namespace)::loadString_abi_cxx11_
                  (&local_208,(_anonymous_namespace_ *)this,(BinaryData *)local_230,
                   (size_t *)&switchD_00166e09::switchdataD_0017e708);
        (anonymous_namespace)::loadString_abi_cxx11_
                  ((string *)(local_230 + 8),(_anonymous_namespace_ *)this,(BinaryData *)local_230,
                   (size_t *)index);
        uVar5 = anon_unknown_4::loadData<unsigned_long>(&this->mImageData,(size_t *)local_230);
        local_1e8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1e8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1e8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        while (bVar12 = uVar5 != 0, uVar5 = uVar5 - 1, bVar12) {
          (anonymous_namespace)::loadString_abi_cxx11_
                    ((string *)&local_1a0,(_anonymous_namespace_ *)this,(BinaryData *)local_230,
                     (size_t *)index);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1e8
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_1a0);
          std::__cxx11::string::~string((string *)&local_1a0);
        }
        if (opCode == NEW_OBJECT) {
          pvVar8 = Loader::Function::instructions(this_01);
          std::__cxx11::string::string((string *)&local_e0,(string *)(local_230 + 8));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_a0,&local_1e8);
          Loader::Instruction::makeNewObject(&local_1a0,&local_e0,&local_a0);
          std::vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
          ::emplace_back<stackjit::Loader::Instruction>(pvVar8,&local_1a0);
          Loader::Instruction::~Instruction(&local_1a0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_a0);
          psVar10 = &local_e0;
        }
        else {
          pvVar8 = Loader::Function::instructions(this_01);
          std::__cxx11::string::string((string *)&local_100,(string *)(local_230 + 8));
          std::__cxx11::string::string((string *)&local_120,(string *)&local_208);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_138,&local_1e8);
          Loader::Instruction::makeCallInstance(&local_1a0,&local_100,&local_120,&local_138);
          std::vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
          ::emplace_back<stackjit::Loader::Instruction>(pvVar8,&local_1a0);
          Loader::Instruction::~Instruction(&local_1a0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_138);
          std::__cxx11::string::~string((string *)&local_120);
          psVar10 = &local_100;
        }
        std::__cxx11::string::~string((string *)psVar10);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1e8);
        psVar10 = (string *)(local_230 + 8);
        goto LAB_00167254;
      default:
        goto switchD_00166e09_default;
      }
      Loader::Instruction::~Instruction(&local_1a0);
switchD_00166e09_default:
      uVar5 = local_1a8 + 1;
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_erase(local_1c8,local_1c0);
  }
  return local_1b8 != 0;
}

Assistant:

bool AssemblyImage::loadFunctionBody(std::string function) {
		if (mFunctionBodyOffsets.count(function) > 0) {
			auto bodyOffset = mFunctionBodyOffsets[function];

			Loader::Function& func = mFunctions[function];
			func.attributes() = AssemblyImageLoader::loadAttributes(mImageData, bodyOffset);

			auto numLocals = loadData<std::size_t>(mImageData, bodyOffset);
			for (std::size_t i = 0; i < numLocals; i++) {
				auto local = loadString(mImageData, bodyOffset);
				func.localTypes().push_back(local);
			}

			auto numInst = loadData<std::size_t>(mImageData, bodyOffset);
			for (std::size_t i = 0; i < numInst; i++) {
				auto format = (Loader::InstructionFormats)loadData<char>(mImageData, bodyOffset);
				auto opCode = (OpCodes)loadData<unsigned char>(mImageData, bodyOffset);

				switch (format) {
					case Loader::InstructionFormats::OpCodeOnly:
						func.instructions().push_back(Loader::Instruction::make(opCode));
						break;
					case Loader::InstructionFormats::IntData: {
							auto value = loadData<int>(mImageData, bodyOffset);
							func.instructions().push_back(Loader::Instruction::makeWithInt(opCode, value));
						}
						break;
					case Loader::InstructionFormats::FloatData:	{
							auto value = loadData<float>(mImageData, bodyOffset);
							func.instructions().push_back(Loader::Instruction::makeWithFloat(opCode, value));
						}
						break;
					case Loader::InstructionFormats::CharData: {
							auto value = loadData<char>(mImageData, bodyOffset);
							func.instructions().push_back(Loader::Instruction::makeWithChar(opCode, value));
						}
						break;
					case Loader::InstructionFormats::StringData: {
							auto value = loadString(mImageData, bodyOffset);
							func.instructions().push_back(Loader::Instruction::makeWithString(opCode, value));
						}
						break;
					case Loader::InstructionFormats::StringConstantData: {
							auto value = loadString(mImageData, bodyOffset);
							func.instructions().push_back(Loader::Instruction::makeWithStringConstant(opCode, value));
						}
						break;
					case Loader::InstructionFormats::Call: {
							auto funcName = loadString(mImageData, bodyOffset);
							auto numParams = loadData<std::size_t>(mImageData, bodyOffset);
							std::vector<std::string> params;

							for (std::size_t j = 0; j < numParams; j++) {
								params.push_back(loadString(mImageData, bodyOffset));
							}

							func.instructions().push_back(Loader::Instruction::makeCall(funcName, params));
						}
						break;
					case Loader::InstructionFormats::CallInstance: {
							auto funcName = loadString(mImageData, bodyOffset);
							auto calledClassType = loadString(mImageData, bodyOffset);
							auto numParams = loadData<std::size_t>(mImageData, bodyOffset);
							std::vector<std::string> params;

							for (std::size_t j = 0; j < numParams; j++) {
								params.push_back(loadString(mImageData, bodyOffset));
							}

							if (opCode == OpCodes::NEW_OBJECT) {
								func.instructions().push_back(Loader::Instruction::makeNewObject(
									calledClassType,
									params));
							} else {
								func.instructions().push_back(Loader::Instruction::makeCallInstance(
									calledClassType,
									funcName,
									params));
							}
						}
						break;
				}
			}

			mFunctionBodyOffsets.erase(function);
			return true;
		}

		return false;
	}